

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<Assimp::FIBase64Value> __thiscall
Assimp::FIBase64Value::create
          (FIBase64Value *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Assimp::FIBase64Value> sVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value_local;
  
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)value;
  value_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  std::
  make_shared<Assimp::FIBase64ValueImpl,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&local_28);
  std::shared_ptr<Assimp::FIBase64Value>::shared_ptr<Assimp::FIBase64ValueImpl,void>
            ((shared_ptr<Assimp::FIBase64Value> *)this,
             (shared_ptr<Assimp::FIBase64ValueImpl> *)&local_28);
  std::shared_ptr<Assimp::FIBase64ValueImpl>::~shared_ptr
            ((shared_ptr<Assimp::FIBase64ValueImpl> *)&local_28);
  sVar1.super___shared_ptr<Assimp::FIBase64Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Assimp::FIBase64Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIBase64Value>)
         sVar1.super___shared_ptr<Assimp::FIBase64Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIBase64Value> FIBase64Value::create(std::vector<uint8_t> &&value) {
    return std::make_shared<FIBase64ValueImpl>(std::move(value));
}